

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_Solaris_ACL(archive_read *a,tar *tar,archive_entry *entry,void *h,int64_t *unconsumed
                          )

{
  mode_t p_00;
  int64_t iVar1;
  char *_p;
  archive_string_conv *paVar2;
  archive_acl *acl_00;
  int *piVar3;
  char *local_80;
  char *p;
  char *acl;
  uint64_t type;
  wchar_t acl_type;
  wchar_t err;
  size_t size;
  archive_string acl_text;
  archive_entry_header_ustar *header;
  int64_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  acl_text.buffer_length = (size_t)h;
  iVar1 = tar_atol((char *)((long)h + 0x7c),0xc);
  size = 0;
  acl_text.s = (char *)0x0;
  acl_text.length = 0;
  a_local._4_4_ = read_body_to_string(a,tar,(archive_string *)&size,h,unconsumed);
  if (a_local._4_4_ == L'\0') {
    acl = (char *)0x0;
    for (local_80 = (char *)size; *local_80 != '\0' && local_80 < (char *)(size + iVar1);
        local_80 = local_80 + 1) {
      if ((*local_80 < '0') || ('7' < *local_80)) {
        archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (invalid digit)");
        archive_string_free((archive_string *)&size);
        return L'\xffffffec';
      }
      acl = (char *)((long)(*local_80 + -0x30) + (long)acl * 8);
      if ((char *)0xffffff < acl) {
        archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (count too large)");
        archive_string_free((archive_string *)&size);
        return L'\xffffffec';
      }
    }
    if (((ulong)acl & 0xfffffffffffc0000) == 0x40000) {
      type._0_4_ = L'Ā';
    }
    else {
      if (((ulong)acl & 0xfffffffffffc0000) != 0xc0000) {
        archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %lo)",
                          acl);
        archive_string_free((archive_string *)&size);
        return L'\xffffffec';
      }
      type._0_4_ = L'㰀';
    }
    _p = local_80 + 1;
    if (_p < (char *)(size + iVar1)) {
      for (local_80 = _p; *local_80 != '\0' && local_80 < _p + (iVar1 - ((long)_p - size));
          local_80 = local_80 + 1) {
      }
      if (tar->sconv_acl == (archive_string_conv *)0x0) {
        paVar2 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        tar->sconv_acl = paVar2;
        if (tar->sconv_acl == (archive_string_conv *)0x0) {
          archive_string_free((archive_string *)&size);
          return L'\xffffffe2';
        }
      }
      (tar->localname).length = 0;
      archive_strncat(&tar->localname,_p,(long)local_80 - (long)_p);
      acl_00 = archive_entry_acl(entry);
      a_local._4_4_ =
           archive_acl_from_text_l(acl_00,(tar->localname).s,(wchar_t)type,tar->sconv_acl);
      p_00 = archive_entry_perm(entry);
      archive_entry_set_perm(entry,p_00);
      if (a_local._4_4_ != L'\0') {
        piVar3 = __errno_location();
        if (*piVar3 == 0xc) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for ACL");
        }
        else {
          archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unparsable)");
        }
      }
      archive_string_free((archive_string *)&size);
    }
    else {
      archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (body overflow)");
      archive_string_free((archive_string *)&size);
      a_local._4_4_ = L'\xffffffec';
    }
  }
  else {
    archive_string_free((archive_string *)&size);
  }
  return a_local._4_4_;
}

Assistant:

static int
header_Solaris_ACL(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, int64_t *unconsumed)
{
	const struct archive_entry_header_ustar *header;
	struct archive_string	 acl_text;
	size_t size;
	int err, acl_type;
	uint64_t type;
	char *acl, *p;

	header = (const struct archive_entry_header_ustar *)h;
	size = (size_t)tar_atol(header->size, sizeof(header->size));
	archive_string_init(&acl_text);
	err = read_body_to_string(a, tar, &acl_text, h, unconsumed);
	if (err != ARCHIVE_OK) {
		archive_string_free(&acl_text);
		return (err);
	}

	/* TODO: Examine the first characters to see if this
	 * is an AIX ACL descriptor.  We'll likely never support
	 * them, but it would be polite to recognize and warn when
	 * we do see them. */

	/* Leading octal number indicates ACL type and number of entries. */
	p = acl = acl_text.s;
	type = 0;
	while (*p != '\0' && p < acl + size) {
		if (*p < '0' || *p > '7') {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (invalid digit)");
			archive_string_free(&acl_text);
			return(ARCHIVE_WARN);
		}
		type <<= 3;
		type += *p - '0';
		if (type > 077777777) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (count too large)");
			archive_string_free(&acl_text);
			return (ARCHIVE_WARN);
		}
		p++;
	}
	switch (type & ~0777777) {
	case 01000000:
		/* POSIX.1e ACL */
		acl_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		break;
	case 03000000:
		/* NFSv4 ACL */
		acl_type = ARCHIVE_ENTRY_ACL_TYPE_NFS4;
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Malformed Solaris ACL attribute (unsupported type %"
		    PRIo64 ")", type);
		archive_string_free(&acl_text);
		return (ARCHIVE_WARN);
	}
	p++;

	if (p >= acl + size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Malformed Solaris ACL attribute (body overflow)");
		archive_string_free(&acl_text);
		return(ARCHIVE_WARN);
	}

	/* ACL text is null-terminated; find the end. */
	size -= (p - acl);
	acl = p;

	while (*p != '\0' && p < acl + size)
		p++;

	if (tar->sconv_acl == NULL) {
		tar->sconv_acl = archive_string_conversion_from_charset(
		    &(a->archive), "UTF-8", 1);
		if (tar->sconv_acl == NULL) {
			archive_string_free(&acl_text);
			return (ARCHIVE_FATAL);
		}
	}
	archive_strncpy(&(tar->localname), acl, p - acl);
	err = archive_acl_from_text_l(archive_entry_acl(entry),
	    tar->localname.s, acl_type, tar->sconv_acl);
	/* Workaround: Force perm_is_set() to be correct */
	/* If this bit were stored in the ACL, this wouldn't be needed */
	archive_entry_set_perm(entry, archive_entry_perm(entry));
	if (err != ARCHIVE_OK) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for ACL");
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (unparsable)");
	}
	archive_string_free(&acl_text);
	return (err);
}